

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UartSerial.cpp
# Opt level: O2

int __thiscall
serial_wiring::UartSerial::_registerSerialEventCallback
          (UartSerial *this,serial_event_t uponBytesAvailable_,void *context_)

{
  UartSerial *local_30;
  thread local_28;
  code *local_20;
  undefined8 local_18;
  
  if (this->_serial_file_descriptor == -1) {
    perror("UartSerial::registerSerialEventCallback - Invalid file descriptor");
  }
  else {
    this->_bytesAvailableCallback = uponBytesAvailable_;
    this->_bytes_available_context = context_;
    if ((uponBytesAvailable_ != (serial_event_t)0x0) && (((this->_polling)._M_base._M_i & 1U) == 0))
    {
      local_20 = pollForSerialData;
      local_18 = 0;
      local_30 = this;
      std::thread::thread<void(serial_wiring::UartSerial::*)(),serial_wiring::UartSerial*,void>
                (&local_28,(type *)&local_20,&local_30);
      std::thread::operator=(&this->_poll_thread,&local_28);
      std::thread::~thread(&local_28);
    }
  }
  return 0;
}

Assistant:

int
UartSerial::_registerSerialEventCallback (
    serial_event_t uponBytesAvailable_,
    void * context_
) {
    if ( -1 == _serial_file_descriptor ) {
        ::perror("UartSerial::registerSerialEventCallback - Invalid file descriptor");
    } else {
        _bytesAvailableCallback = uponBytesAvailable_;
        _bytes_available_context = context_;

        if ( _bytesAvailableCallback && !_polling ) {
            _poll_thread = std::thread(&UartSerial::pollForSerialData, this);
        }
    }
    return 0;
}